

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::invalidateBasisArtifacts(HEkk *this)

{
  long in_RDI;
  
  *(undefined1 *)(in_RDI + 0x2555) = 0;
  *(undefined1 *)(in_RDI + 0x2557) = 0;
  *(undefined1 *)(in_RDI + 0x2558) = 0;
  *(undefined1 *)(in_RDI + 0x2559) = 0;
  *(undefined1 *)(in_RDI + 0x255a) = 0;
  *(undefined1 *)(in_RDI + 0x255b) = 0;
  *(undefined1 *)(in_RDI + 0x255c) = 0;
  clearRayRecords(this);
  return;
}

Assistant:

void HEkk::invalidateBasisArtifacts() {
  // Invalidate the artifacts of the basis of the simplex LP
  this->status_.has_ar_matrix = false;
  this->status_.has_dual_steepest_edge_weights = false;
  this->status_.has_invert = false;
  this->status_.has_fresh_invert = false;
  this->status_.has_fresh_rebuild = false;
  this->status_.has_dual_objective_value = false;
  this->status_.has_primal_objective_value = false;
  this->clearRayRecords();
}